

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void av1_iadst8_low1_ssse3(__m128i *input,__m128i *output)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  undefined1 auVar5 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i alVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i alVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i alVar33;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  auVar2 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  uVar1 = auVar2._0_4_;
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar2 = pshuflw(ZEXT416(0xffff80a0),ZEXT416(0xffff80a0),0);
  auVar2._4_4_ = auVar2._0_4_;
  auVar2._8_4_ = auVar2._0_4_;
  auVar2._12_4_ = auVar2._0_4_;
  alVar4 = (__m128i)pmulhrsw(auVar24,(undefined1  [16])*input);
  auVar2 = pmulhrsw(auVar2,(undefined1  [16])*input);
  *output = alVar4;
  auVar7._0_12_ = alVar4._0_12_;
  auVar7._12_2_ = alVar4[0]._6_2_;
  auVar7._14_2_ = auVar2._6_2_;
  auVar31._12_4_ = auVar7._12_4_;
  auVar31._0_10_ = alVar4._0_10_;
  auVar31._10_2_ = auVar2._4_2_;
  auVar6._10_6_ = auVar31._10_6_;
  auVar6._0_8_ = alVar4[0];
  auVar6._8_2_ = alVar4[0]._4_2_;
  auVar5._8_8_ = auVar6._8_8_;
  auVar5._6_2_ = auVar2._2_2_;
  auVar5._4_2_ = alVar4[0]._2_2_;
  auVar5._0_2_ = (undefined2)alVar4[0];
  auVar5._2_2_ = auVar2._0_2_;
  auVar3._2_2_ = auVar2._8_2_;
  auVar3._0_2_ = (short)alVar4[1];
  auVar3._4_2_ = alVar4[1]._2_2_;
  auVar3._6_2_ = auVar2._10_2_;
  auVar3._8_2_ = alVar4[1]._4_2_;
  auVar3._10_2_ = auVar2._12_2_;
  auVar3._12_2_ = alVar4[1]._6_2_;
  auVar3._14_2_ = auVar2._14_2_;
  auVar12._8_4_ = 0x61f0ec8;
  auVar12._0_8_ = 0x61f0ec8061f0ec8;
  auVar12._12_4_ = 0x61f0ec8;
  auVar16 = pmaddwd(auVar5,auVar12);
  auVar13 = pmaddwd(auVar12,auVar3);
  auVar23._8_4_ = 0xf138061f;
  auVar23._0_8_ = 0xf138061ff138061f;
  auVar23._12_4_ = 0xf138061f;
  auVar9 = pmaddwd(auVar5,auVar23);
  auVar24 = pmaddwd(auVar23,auVar3);
  auVar17._0_4_ = auVar16._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar16._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar16._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar16._12_4_ + 0x800 >> 0xc;
  auVar14._0_4_ = auVar13._0_4_ + 0x800 >> 0xc;
  auVar14._4_4_ = auVar13._4_4_ + 0x800 >> 0xc;
  auVar14._8_4_ = auVar13._8_4_ + 0x800 >> 0xc;
  auVar14._12_4_ = auVar13._12_4_ + 0x800 >> 0xc;
  auVar16 = packssdw(auVar17,auVar14);
  auVar10._0_4_ = auVar9._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar9._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar9._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar9._12_4_ + 0x800 >> 0xc;
  auVar25._0_4_ = auVar24._0_4_ + 0x800 >> 0xc;
  auVar25._4_4_ = auVar24._4_4_ + 0x800 >> 0xc;
  auVar25._8_4_ = auVar24._8_4_ + 0x800 >> 0xc;
  auVar25._12_4_ = auVar24._12_4_ + 0x800 >> 0xc;
  alVar11 = (__m128i)packssdw(auVar10,auVar25);
  auVar26._8_4_ = 0xb500b50;
  auVar26._0_8_ = 0xb500b500b500b50;
  auVar26._12_4_ = 0xb500b50;
  auVar13 = pmaddwd(auVar5,auVar26);
  auVar24 = pmaddwd(auVar3,auVar26);
  auVar30._8_4_ = 0xf4b00b50;
  auVar30._0_8_ = 0xf4b00b50f4b00b50;
  auVar30._12_4_ = 0xf4b00b50;
  auVar9 = pmaddwd(auVar5,auVar30);
  auVar3 = pmaddwd(auVar3,auVar30);
  auVar15._0_4_ = auVar13._0_4_ + 0x800 >> 0xc;
  auVar15._4_4_ = auVar13._4_4_ + 0x800 >> 0xc;
  auVar15._8_4_ = auVar13._8_4_ + 0x800 >> 0xc;
  auVar15._12_4_ = auVar13._12_4_ + 0x800 >> 0xc;
  auVar28._0_4_ = auVar24._0_4_ + 0x800 >> 0xc;
  auVar28._4_4_ = auVar24._4_4_ + 0x800 >> 0xc;
  auVar28._8_4_ = auVar24._8_4_ + 0x800 >> 0xc;
  auVar28._12_4_ = auVar24._12_4_ + 0x800 >> 0xc;
  auVar24 = packssdw(auVar15,auVar28);
  auVar8._0_4_ = auVar9._0_4_ + 0x800 >> 0xc;
  auVar8._4_4_ = auVar9._4_4_ + 0x800 >> 0xc;
  auVar8._8_4_ = auVar9._8_4_ + 0x800 >> 0xc;
  auVar8._12_4_ = auVar9._12_4_ + 0x800 >> 0xc;
  auVar9._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar9._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar9._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar9._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  alVar4 = (__m128i)packssdw(auVar8,auVar9);
  alVar29 = (__m128i)psubsw((undefined1  [16])0x0,auVar16);
  auVar21._0_12_ = auVar16._0_12_;
  auVar21._12_2_ = auVar16._6_2_;
  auVar21._14_2_ = alVar11[0]._6_2_;
  auVar20._12_4_ = auVar21._12_4_;
  auVar20._0_10_ = auVar16._0_10_;
  auVar20._10_2_ = alVar11[0]._4_2_;
  auVar19._10_6_ = auVar20._10_6_;
  auVar19._0_8_ = auVar16._0_8_;
  auVar19._8_2_ = auVar16._4_2_;
  auVar18._8_8_ = auVar19._8_8_;
  auVar18._6_2_ = alVar11[0]._2_2_;
  auVar18._4_2_ = auVar16._2_2_;
  auVar18._0_2_ = auVar16._0_2_;
  auVar18._2_2_ = (short)alVar11[0];
  auVar13._2_2_ = (short)alVar11[1];
  auVar13._0_2_ = auVar16._8_2_;
  auVar13._4_2_ = auVar16._10_2_;
  auVar13._6_2_ = alVar11[1]._2_2_;
  auVar13._8_2_ = auVar16._12_2_;
  auVar13._10_2_ = alVar11[1]._4_2_;
  auVar13._12_2_ = auVar16._14_2_;
  auVar13._14_2_ = alVar11[1]._6_2_;
  auVar31 = pmaddwd(auVar18,auVar26);
  auVar16 = pmaddwd(auVar26,auVar13);
  auVar9 = pmaddwd(auVar18,auVar30);
  auVar3 = pmaddwd(auVar13,auVar30);
  auVar32._0_4_ = auVar31._0_4_ + 0x800 >> 0xc;
  auVar32._4_4_ = auVar31._4_4_ + 0x800 >> 0xc;
  auVar32._8_4_ = auVar31._8_4_ + 0x800 >> 0xc;
  auVar32._12_4_ = auVar31._12_4_ + 0x800 >> 0xc;
  auVar27._0_4_ = auVar16._0_4_ + 0x800 >> 0xc;
  auVar27._4_4_ = auVar16._4_4_ + 0x800 >> 0xc;
  auVar27._8_4_ = auVar16._8_4_ + 0x800 >> 0xc;
  auVar27._12_4_ = auVar16._12_4_ + 0x800 >> 0xc;
  alVar33 = (__m128i)packssdw(auVar32,auVar27);
  auVar22._0_4_ = auVar9._0_4_ + 0x800 >> 0xc;
  auVar22._4_4_ = auVar9._4_4_ + 0x800 >> 0xc;
  auVar22._8_4_ = auVar9._8_4_ + 0x800 >> 0xc;
  auVar22._12_4_ = auVar9._12_4_ + 0x800 >> 0xc;
  auVar16._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar3 = packssdw(auVar22,auVar16);
  output[1] = alVar29;
  output[2] = alVar33;
  alVar29 = (__m128i)psubsw((undefined1  [16])0x0,auVar24);
  output[3] = alVar29;
  output[4] = alVar4;
  alVar4 = (__m128i)psubsw((undefined1  [16])0x0,auVar3);
  output[5] = alVar4;
  output[6] = alVar11;
  alVar4 = (__m128i)psubsw((undefined1  [16])0x0,auVar2);
  output[7] = alVar4;
  return;
}

Assistant:

void av1_iadst8_low1_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);

  // stage 1
  __m128i x[8];
  x[1] = input[0];

  // stage 2
  btf_16_ssse3(cospi[60], -cospi[4], x[1], x[0], x[1]);

  // stage 3
  x[4] = x[0];
  x[5] = x[1];

  // stage 4
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);

  // stage 5
  x[2] = x[0];
  x[3] = x[1];
  x[6] = x[4];
  x[7] = x[5];

  // stage 6
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[2], x[3], x[2], x[3]);
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[6], x[7], x[6], x[7]);

  // stage 7
  output[0] = x[0];
  output[1] = _mm_subs_epi16(__zero, x[4]);
  output[2] = x[6];
  output[3] = _mm_subs_epi16(__zero, x[2]);
  output[4] = x[3];
  output[5] = _mm_subs_epi16(__zero, x[7]);
  output[6] = x[5];
  output[7] = _mm_subs_epi16(__zero, x[1]);
}